

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::processElementDeclRef
          (TraverseSchema *this,DOMElement *elem,XMLCh *refName)

{
  ulong uVar1;
  XSAnnotation *pXVar2;
  ComplexTypeInfo *pCVar3;
  ulong uVar4;
  MemoryManager *pMVar5;
  XMLSize_t XVar6;
  int iVar7;
  XMLSize_t index;
  DOMElement *pDVar8;
  SchemaElementDecl *pSVar9;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *pBVar10;
  undefined4 extraout_var;
  long lVar11;
  ulong uVar12;
  
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,0x11,this,false,this->fNonXSAttList);
  pDVar8 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar8 = checkContent(this,elem,pDVar8,true,true);
  pXVar2 = this->fAnnotation;
  if (pDVar8 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x1f,L"element",
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  pSVar9 = getGlobalElemDecl(this,elem,refName);
  if (pSVar9 == (SchemaElementDecl *)0x0) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x27,refName,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    goto LAB_0032d908;
  }
  pCVar3 = this->fCurrentComplexType;
  if (pCVar3 == (ComplexTypeInfo *)0x0) goto LAB_0032d8a8;
  pBVar10 = &pCVar3->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
  if (pBVar10 == (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
    pBVar10 = (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)
              XMemory::operator_new(0x30,pCVar3->fMemoryManager);
    pMVar5 = pCVar3->fMemoryManager;
    ((BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)&pBVar10->_vptr_BaseRefVectorOf)->
    _vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00409870;
    pBVar10->fAdoptedElems = false;
    pBVar10->fCurCount = 0;
    pBVar10->fMaxCount = 8;
    pBVar10->fElemList = (SchemaElementDecl **)0x0;
    pBVar10->fMemoryManager = pMVar5;
    iVar7 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,0x40);
    pBVar10->fElemList = (SchemaElementDecl **)CONCAT44(extraout_var,iVar7);
    lVar11 = 0;
    do {
      pBVar10->fElemList[lVar11] = (SchemaElementDecl *)0x0;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 8);
    ((BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)&pBVar10->_vptr_BaseRefVectorOf)->
    _vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_004097f8;
    pCVar3->fElements = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)pBVar10;
LAB_0032d885:
    BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(pBVar10,1);
    XVar6 = pBVar10->fCurCount;
    pBVar10->fElemList[XVar6] = pSVar9;
    pBVar10->fCurCount = XVar6 + 1;
  }
  else {
    uVar4 = pBVar10->fCurCount;
    if (uVar4 == 0) goto LAB_0032d885;
    if (*pBVar10->fElemList != pSVar9) {
      uVar12 = 0;
      do {
        if (uVar4 - 1 == uVar12) goto LAB_0032d885;
        uVar1 = uVar12 + 1;
        lVar11 = uVar12 + 1;
        uVar12 = uVar1;
      } while (pBVar10->fElemList[lVar11] != pSVar9);
      if (uVar4 <= uVar1) goto LAB_0032d885;
    }
  }
LAB_0032d8a8:
  if (this->fCurrentGroupInfo == (XercesGroupInfo *)0x0) goto LAB_0032d908;
  pBVar10 = &this->fCurrentGroupInfo->fElements->
             super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
  uVar4 = pBVar10->fCurCount;
  if (uVar4 != 0) {
    if (*pBVar10->fElemList == pSVar9) goto LAB_0032d908;
    uVar12 = 0;
    do {
      if (uVar4 - 1 == uVar12) goto LAB_0032d8e8;
      uVar1 = uVar12 + 1;
      lVar11 = uVar12 + 1;
      uVar12 = uVar1;
    } while (pBVar10->fElemList[lVar11] != pSVar9);
    if (uVar1 < uVar4) goto LAB_0032d908;
  }
LAB_0032d8e8:
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(pBVar10,1);
  XVar6 = pBVar10->fCurCount;
  pBVar10->fElemList[XVar6] = pSVar9;
  pBVar10->fCurCount = XVar6 + 1;
LAB_0032d908:
  if (pXVar2 != (XSAnnotation *)0x0) {
    (*(pXVar2->super_XSerializable)._vptr_XSerializable[1])(pXVar2);
  }
  return pSVar9;
}

Assistant:

SchemaElementDecl*
TraverseSchema::processElementDeclRef(const DOMElement* const elem,
                                      const XMLCh* const refName)
{
    // check attributes
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_ElementRef, this, false, fNonXSAttList
    );

    // handle annotation
    DOMElement* content = checkContent(elem, XUtil::getFirstChildElement(elem), true);
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // do not generate synthetic annotation for element reference...

    if (content != 0)
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::NoContentForRef, SchemaSymbols::fgELT_ELEMENT);

    SchemaElementDecl* refElemDecl = getGlobalElemDecl(elem, refName);

    if (!refElemDecl)
    {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::RefElementNotFound, refName);
    }
    else
    {
        if (fCurrentComplexType)
            fCurrentComplexType->addElement(refElemDecl);

        if (fCurrentGroupInfo)
            fCurrentGroupInfo->addElement(refElemDecl);
    }

    return refElemDecl;
}